

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEvaluatedTargetProperty.cxx
# Opt level: O2

void anon_unknown.dwarf_1446adc::addInterfaceEntry
               (cmGeneratorTarget *headTarget,string *config,string *prop,string *lang,
               cmGeneratorExpressionDAGChecker *dagChecker,EvaluatedTargetPropertyEntries *entries,
               LinkInterfaceFor interfaceFor,
               vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libraries)

{
  cmListFileBacktrace *pcVar1;
  cmLocalGenerator *lg;
  pointer pcVar2;
  string_view value;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_278;
  EvaluatedTargetPropertyEntries *local_268;
  string *local_260;
  cmGeneratorExpressionDAGChecker *local_258;
  string *local_250;
  string *local_248;
  pointer local_240;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_238;
  string local_228;
  EvaluatedTargetPropertyEntry local_208;
  string local_1d0;
  string local_1b0;
  cmGeneratorExpressionContext context;
  
  local_240 = (libraries->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  local_268 = entries;
  local_260 = prop;
  local_258 = dagChecker;
  local_250 = lang;
  local_248 = config;
  for (pcVar2 = (libraries->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>).
                _M_impl.super__Vector_impl_data._M_start; pcVar2 != local_240; pcVar2 = pcVar2 + 1)
  {
    if ((pcVar2->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0) {
      pcVar1 = &(pcVar2->super_cmLinkItem).Backtrace;
      std::
      __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_278,
                     (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      *)pcVar1);
      local_208.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_278._M_ptr;
      local_208.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_278._M_refcount._M_pi;
      local_278._M_ptr = (element_type *)0x0;
      local_278._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_208.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_208._41_8_ = 0;
      local_208.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_208.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_208.LinkImplItem = pcVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
      lg = cmGeneratorTarget::GetLocalGenerator(headTarget);
      std::__cxx11::string::string((string *)&local_1b0,(string *)local_248);
      std::
      __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_238,
                     (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      *)pcVar1);
      std::__cxx11::string::string((string *)&local_1d0,(string *)local_250);
      cmGeneratorExpressionContext::cmGeneratorExpressionContext
                (&context,lg,&local_1b0,false,headTarget,headTarget,true,
                 (cmListFileBacktrace *)&local_238,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_238._M_refcount);
      std::__cxx11::string::~string((string *)&local_1b0);
      cmGeneratorTarget::EvaluateInterfaceProperty
                (&local_228,(pcVar2->super_cmLinkItem).Target,local_260,&context,local_258,
                 interfaceFor);
      value._M_str = local_228._M_dataplus._M_p;
      value._M_len = local_228._M_string_length;
      cmList::append(&local_208.Values,value,No);
      std::__cxx11::string::~string((string *)&local_228);
      local_208.ContextDependent = context.HadContextSensitiveCondition;
      std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
      emplace_back<EvaluatedTargetPropertyEntry>(&local_268->Entries,&local_208);
      cmGeneratorExpressionContext::~cmGeneratorExpressionContext(&context);
      EvaluatedTargetPropertyEntry::~EvaluatedTargetPropertyEntry(&local_208);
    }
  }
  return;
}

Assistant:

void addInterfaceEntry(cmGeneratorTarget const* headTarget,
                       std::string const& config, std::string const& prop,
                       std::string const& lang,
                       cmGeneratorExpressionDAGChecker* dagChecker,
                       EvaluatedTargetPropertyEntries& entries,
                       cmGeneratorTarget::LinkInterfaceFor interfaceFor,
                       std::vector<cmLinkImplItem> const& libraries)
{
  for (cmLinkImplItem const& lib : libraries) {
    if (lib.Target) {
      EvaluatedTargetPropertyEntry ee(lib, lib.Backtrace);
      // Pretend $<TARGET_PROPERTY:lib.Target,prop> appeared in our
      // caller's property and hand-evaluate it as if it were compiled.
      // Create a context as cmCompiledGeneratorExpression::Evaluate does.
      cmGeneratorExpressionContext context(
        headTarget->GetLocalGenerator(), config, false, headTarget, headTarget,
        true, lib.Backtrace, lang);
      cmExpandList(lib.Target->EvaluateInterfaceProperty(
                     prop, &context, dagChecker, interfaceFor),
                   ee.Values);
      ee.ContextDependent = context.HadContextSensitiveCondition;
      entries.Entries.emplace_back(std::move(ee));
    }
  }
}